

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O1

bool AlphaVectorPruning::FindBelief
               (AlphaVector *p,ValueFunctionPOMDPDiscrete *uU,
               vector<double,_std::allocator<double>_> *belief,size_t acceleratedPruningThreshold)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pAVar3;
  bool bVar4;
  ulong uVar5;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if ((acceleratedPruningThreshold == 0) ||
     (belief = (vector<double,_std::allocator<double>_> *)
               (((long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x3333333333333333),
     belief < acceleratedPruningThreshold)) {
    FindBeliefNormal(p,uU,belief);
    belief = extraout_RDX;
  }
  bVar4 = FindBeliefAccelerated(p,uU,belief);
  pdVar2 = (p->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(p->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  iVar9 = (int)(uVar6 >> 3);
  if (iVar9 != 0) {
    uVar6 = (long)uVar6 >> 3;
    pAVar3 = (uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pAVar3 >> 3;
    auVar10 = ZEXT816(0) << 0x40;
    uVar8 = 0;
    do {
      uVar7 = uVar6;
      if ((uVar6 <= uVar8) || (uVar7 = uVar5, uVar5 <= uVar8)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   auVar10._0_8_,uVar8,uVar7);
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pdVar2[uVar8];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(&pAVar3->_m_action + uVar8 * 2);
      auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar1);
      uVar8 = uVar8 + 1;
    } while (iVar9 != (int)uVar8);
  }
  return bVar4;
}

Assistant:

bool AlphaVectorPruning::FindBelief(const AlphaVector &p,
                                    const ValueFunctionPOMDPDiscrete &uU,
                                    vector<double> &belief,
                                    size_t acceleratedPruningThreshold)
{
    // if the threshold is set to 0, accelerated pruning is disabled
    if(acceleratedPruningThreshold==0 ||
       uU.size() < acceleratedPruningThreshold)
    {
        return FindBeliefNormal(p, uU, belief);
    }
    else
    {
        return FindBeliefAccelerated(p, uU, belief);
    }
}